

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall embree::SceneGraph::GroupNode::bezier_to_hermite(GroupNode *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RDI;
  size_t i;
  Ref<embree::SceneGraph::Node> *in_stack_00000118;
  Node *local_60;
  long *local_58;
  ulong local_50;
  long **local_40;
  Node **local_30;
  reference local_20;
  Node **local_18;
  long **local_10;
  reference local_8;
  
  local_50 = 0;
  while( true ) {
    uVar1 = local_50;
    sVar2 = std::
            vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
            ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    *)(in_RDI + 0x68));
    if (sVar2 <= uVar1) break;
    local_20 = std::
               vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                             *)(in_RDI + 0x68),local_50);
    local_18 = &local_60;
    local_60 = local_20->ptr;
    if (local_60 != (Node *)0x0) {
      (*(local_60->super_RefCount)._vptr_RefCount[2])();
    }
    convert_bezier_to_hermite(in_stack_00000118);
    pvVar3 = std::
             vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                           *)(in_RDI + 0x68),local_50);
    local_10 = &local_58;
    local_8 = pvVar3;
    if (pvVar3->ptr != (Node *)0x0) {
      (*(pvVar3->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pvVar3->ptr = (Node *)*local_10;
    *local_10 = (long *)0x0;
    local_40 = &local_58;
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 0x18))();
    }
    local_30 = &local_60;
    if (local_60 != (Node *)0x0) {
      (*(local_60->super_RefCount)._vptr_RefCount[3])();
    }
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void bezier_to_hermite()
      {
        for (size_t i=0; i<children.size(); i++)
          children[i] = convert_bezier_to_hermite(children[i]);
      }